

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O3

void SHA512_Transform(SHA512_CTX *c,uchar *data)

{
  undefined8 uVar1;
  ulonglong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulonglong uVar8;
  ulonglong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulonglong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  
  uVar2 = c->h[7];
  uVar3 = c->h[0];
  uVar4 = c->h[1];
  uVar5 = c->h[2];
  uVar6 = c->h[3];
  uVar7 = c->h[4];
  uVar8 = c->h[5];
  uVar9 = c->h[6];
  lVar20 = 0;
  uVar12 = uVar3;
  uVar10 = uVar5;
  uVar14 = uVar6;
  uVar13 = uVar4;
  uVar17 = uVar7;
  uVar21 = uVar2;
  uVar18 = uVar8;
  uVar23 = uVar9;
  do {
    uVar22 = uVar23;
    uVar23 = uVar18;
    uVar18 = uVar17;
    uVar16 = uVar13;
    uVar19 = uVar10;
    uVar13 = uVar12;
    uVar12 = *(ulong *)(data + lVar20);
    uVar1 = swap_bytes(uVar12);
    *(undefined8 *)((long)c->h + lVar20 + 0x50) = uVar1;
    lVar15 = (~uVar18 & uVar22 | uVar23 & uVar18) + uVar21 +
             ((uVar18 >> 0x29 | uVar18 << 0x17) ^
             (uVar18 >> 0x12 | uVar18 << 0x2e) ^ (uVar18 >> 0xe | uVar18 << 0x32)) +
             (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
              (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
              (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
             uVar12 << 0x38) + *(long *)((long)K512 + lVar20);
    lVar20 = lVar20 + 8;
    uVar17 = uVar14 + lVar15;
    uVar12 = (uVar16 & uVar19 ^ (uVar16 ^ uVar19) & uVar13) +
             ((uVar13 >> 0x27 | uVar13 << 0x19) ^
             (uVar13 >> 0x22 | uVar13 << 0x1e) ^ (uVar13 >> 0x1c | uVar13 << 0x24)) + lVar15;
    uVar10 = uVar16;
    uVar14 = uVar19;
    uVar21 = uVar22;
  } while (lVar20 != 0x80);
  lVar20 = 0x1e;
  do {
    uVar25 = uVar16;
    uVar24 = uVar23;
    uVar23 = uVar18;
    uVar16 = uVar13;
    uVar18 = uVar17;
    uVar13 = uVar12;
    uVar11 = (uint)lVar20;
    uVar12 = c->h[(ulong)(uVar11 - 0xd & 0xf) + 10];
    uVar10 = c->h[(ulong)(uVar11 & 0xf) + 10];
    uVar14 = (ulong)(uVar11 - 0xe & 0xf);
    lVar15 = *(long *)(K256 + lVar20 * 2 + 0x34);
    lVar20 = lVar20 + 1;
    uVar21 = (uVar12 >> 7 ^ (uVar12 >> 8 | uVar12 << 0x38) ^ (uVar12 >> 1 | uVar12 << 0x3f)) +
             c->h[(ulong)(uVar11 - 5 & 0xf) + 10] +
             (uVar10 >> 6 ^ (uVar10 >> 0x3d | uVar10 << 3) ^ (uVar10 >> 0x13 | uVar10 << 0x2d)) +
             c->h[uVar14 + 10];
    c->h[uVar14 + 10] = uVar21;
    lVar15 = uVar21 + (~uVar18 & uVar24 | uVar23 & uVar18) + uVar22 +
                      ((uVar18 >> 0x29 | uVar18 << 0x17) ^
                      (uVar18 >> 0x12 | uVar18 << 0x2e) ^ (uVar18 >> 0xe | uVar18 << 0x32)) + lVar15
    ;
    uVar17 = uVar19 + lVar15;
    uVar12 = (uVar16 & uVar25 ^ (uVar16 ^ uVar25) & uVar13) +
             ((uVar13 >> 0x27 | uVar13 << 0x19) ^
             (uVar13 >> 0x22 | uVar13 << 0x1e) ^ (uVar13 >> 0x1c | uVar13 << 0x24)) + lVar15;
    uVar19 = uVar25;
    uVar22 = uVar24;
  } while (lVar20 != 0x5e);
  c->h[0] = uVar12 + uVar3;
  c->h[1] = uVar13 + uVar4;
  c->h[2] = uVar16 + uVar5;
  c->h[3] = uVar25 + uVar6;
  c->h[4] = uVar17 + uVar7;
  c->h[5] = uVar18 + uVar8;
  c->h[6] = uVar23 + uVar9;
  c->h[7] = uVar24 + uVar2;
  return;
}

Assistant:

void SHA512_Transform(SHA512_CTX* context, const sha2_word64* data) {
	sha2_word64	a, b, c, d, e, f, g, h, s0, s1;
	sha2_word64	T1, T2, *W512 = (sha2_word64*)context->buffer;
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = context->state[0];
	b = context->state[1];
	c = context->state[2];
	d = context->state[3];
	e = context->state[4];
	f = context->state[5];
	g = context->state[6];
	h = context->state[7];

	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		REVERSE64(*data++, W512[j]);
		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + W512[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		/* Apply the SHA-512 compression function to update a..h with copy */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + (W512[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W512[(j+1)&0x0f];
		s0 = sigma0_512(s0);
		s1 = W512[(j+14)&0x0f];
		s1 =  sigma1_512(s1);

		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] +
		     (W512[j&0x0f] += s1 + W512[(j+9)&0x0f] + s0);
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 80);

	/* Compute the current intermediate hash value */
	context->state[0] += a;
	context->state[1] += b;
	context->state[2] += c;
	context->state[3] += d;
	context->state[4] += e;
	context->state[5] += f;
	context->state[6] += g;
	context->state[7] += h;
}